

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CpuInfo.cpp
# Opt level: O3

int __thiscall primesieve::CpuInfo::init(CpuInfo *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  _Alloc_hider _Var2;
  int iVar3;
  int extraout_EAX;
  size_t sVar4;
  long *plVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  runtime_error *this_00;
  long *plVar10;
  unsigned_long __val;
  string __str;
  string path;
  string cpusOnline;
  string type;
  string cacheLevel;
  string threadSiblings;
  string sharedCpuMap;
  string sharedCpuList;
  string threadSiblingsList;
  string cacheSize;
  string cacheType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  long *local_198;
  long local_190;
  long local_188;
  long lStack_180;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  CpuInfo *local_98;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_178,"/sys/devices/system/cpu/online","");
  sVar4 = anon_unknown.dwarf_1101f3::parseThreadList(&local_178);
  this->cpuThreads_ = sVar4;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"/sys/devices/system/cpu/cpu0/topology/core_cpus_list","");
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_118,"/sys/devices/system/cpu/cpu0/topology/core_cpus","");
  sVar4 = anon_unknown.dwarf_1101f3::getThreads(&local_b8,&local_118);
  this->threadsPerCore_ = sVar4;
  if (sVar4 == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_b8,0,(char *)local_b8._M_string_length,0x131a5e);
    std::__cxx11::string::_M_replace
              ((ulong)&local_118,0,(char *)local_118._M_string_length,0x131a99);
    sVar4 = anon_unknown.dwarf_1101f3::getThreads(&local_b8,&local_118);
    this->threadsPerCore_ = sVar4;
  }
  if (sVar4 - 1 < 0x400 && this->cpuThreads_ - 1 < 0x100000) {
    this->cpuCores_ = (this->cpuThreads_ & 0xffffffff) / (sVar4 & 0xffffffff);
  }
  __val = 0;
  local_98 = this;
  while( true ) {
    local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_1b8,'\x01');
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_1b8._M_dataplus._M_p,(uint)local_1b8._M_string_length,__val);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,0x131acf);
    local_198 = &local_188;
    plVar10 = plVar5 + 2;
    if ((long *)*plVar5 == plVar10) {
      local_188 = *plVar10;
      lStack_180 = plVar5[3];
    }
    else {
      local_188 = *plVar10;
      local_198 = (long *)*plVar5;
    }
    local_190 = plVar5[1];
    *plVar5 = (long)plVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_138,local_198,local_190 + (long)local_198);
    std::__cxx11::string::append((char *)&local_138);
    anon_unknown.dwarf_1101f3::getString(&local_1b8,&local_138);
    _Var2._M_p = local_1b8._M_dataplus._M_p;
    if (CONCAT44(local_1b8._M_string_length._4_4_,(uint)local_1b8._M_string_length) != 0) break;
    uVar7 = 0;
LAB_0012530f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
    if (uVar7 - 1 < 3) {
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_158,local_198,local_190 + (long)local_198);
      std::__cxx11::string::append((char *)&local_158);
      anon_unknown.dwarf_1101f3::getString(&local_70,&local_158);
      iVar3 = std::__cxx11::string::compare((char *)&local_70);
      if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)&local_70), iVar3 == 0)) {
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_198,local_190 + (long)local_198);
        std::__cxx11::string::append((char *)&local_90);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d8,local_198,local_190 + (long)local_198);
        std::__cxx11::string::append((char *)&local_d8);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,local_198,local_190 + (long)local_198);
        std::__cxx11::string::append((char *)&local_f8);
        anon_unknown.dwarf_1101f3::getString(&local_1b8,&local_90);
        _Var2._M_p = local_1b8._M_dataplus._M_p;
        if (CONCAT44(local_1b8._M_string_length._4_4_,(uint)local_1b8._M_string_length) == 0) {
          uVar8 = 0;
        }
        else {
          piVar6 = __errno_location();
          iVar3 = *piVar6;
          *piVar6 = 0;
          uVar8 = strtoul(_Var2._M_p,(char **)&local_50,10);
          if (local_50._M_dataplus._M_p == _Var2._M_p) goto LAB_001256ed;
          if (*piVar6 == 0) {
            *piVar6 = iVar3;
          }
          else if (*piVar6 == 0x22) goto LAB_001256f9;
          cVar1 = local_1b8._M_dataplus._M_p
                  [CONCAT44(local_1b8._M_string_length._4_4_,(uint)local_1b8._M_string_length) + -1]
          ;
          if (cVar1 == 'G') {
            uVar8 = uVar8 << 0x1e;
          }
          else if (cVar1 == 'M') {
            uVar8 = uVar8 << 0x14;
          }
          else if (cVar1 == 'K') {
            uVar8 = uVar8 << 10;
          }
          else if (9 < (int)cVar1 - 0x30U) goto LAB_00125705;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        (local_98->cacheSizes_)._M_elems[uVar7] = uVar8;
        sVar4 = anon_unknown.dwarf_1101f3::getThreads(&local_d8,&local_f8);
        (local_98->cacheSharing_)._M_elems[uVar7] = sVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if (local_198 != &local_188) {
      operator_delete(local_198,local_188 + 1);
    }
    __val = __val + 1;
    if (__val == 4) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      paVar9 = &local_b8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar9) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        paVar9 = extraout_RAX;
      }
      iVar3 = (int)paVar9;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        iVar3 = extraout_EAX;
      }
      return iVar3;
    }
  }
  piVar6 = __errno_location();
  iVar3 = *piVar6;
  *piVar6 = 0;
  uVar7 = strtoul(_Var2._M_p,(char **)&local_50,10);
  if (local_50._M_dataplus._M_p != _Var2._M_p) {
    if (*piVar6 == 0) {
      *piVar6 = iVar3;
    }
    else if (*piVar6 == 0x22) goto LAB_001256e1;
    goto LAB_0012530f;
  }
  std::__throw_invalid_argument("stoul");
LAB_001256e1:
  std::__throw_out_of_range("stoul");
LAB_001256ed:
  std::__throw_invalid_argument("stoul");
LAB_001256f9:
  std::__throw_out_of_range("stoul");
LAB_00125705:
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,"invalid cache size: ",&local_1b8);
  std::runtime_error::runtime_error(this_00,(string *)&local_50);
  *(undefined ***)this_00 = &PTR__runtime_error_0013f950;
  __cxa_throw(this_00,&primesieve_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void CpuInfo::init()
{
  string cpusOnline = "/sys/devices/system/cpu/online";
  cpuThreads_ = parseThreadList(cpusOnline);

  // Works on Linux kernel >= 5.3
  string threadSiblingsList = "/sys/devices/system/cpu/cpu0/topology/core_cpus_list";
  string threadSiblings = "/sys/devices/system/cpu/cpu0/topology/core_cpus";
  threadsPerCore_ = getThreads(threadSiblingsList, threadSiblings);

  if (!threadsPerCore_)
  {
    // Works on Linux kernel < 5.3
    threadSiblingsList = "/sys/devices/system/cpu/cpu0/topology/thread_siblings_list";
    threadSiblings = "/sys/devices/system/cpu/cpu0/topology/thread_siblings";
    threadsPerCore_ = getThreads(threadSiblingsList, threadSiblings);
  }

  if (hasCpuThreads() &&
      hasThreadsPerCore())
    cpuCores_ = cpuThreads_ / threadsPerCore_;

  // Retrieve CPU cache info
  for (size_t i = 0; i <= 3; i++)
  {
    string path = "/sys/devices/system/cpu/cpu0/cache/index" + to_string(i);
    string cacheLevel = path + "/level";
    size_t level = getValue(cacheLevel);

    if (level >= 1 &&
        level <= 3)
    {
      string type = path + "/type";
      string cacheType = getString(type);

      if (cacheType == "Data" ||
          cacheType == "Unified")
      {
        string cacheSize = path + "/size";
        string sharedCpuList = path + "/shared_cpu_list";
        string sharedCpuMap = path + "/shared_cpu_map";
        cacheSizes_[level] = getCacheSize(cacheSize);
        cacheSharing_[level] = getThreads(sharedCpuList, sharedCpuMap);
      }
    }
  }
}